

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DExporter::AttrHelper_Col4DArrToString
          (X3DExporter *this,aiColor4D *pArray,size_t pArray_Size,string *pTargetString)

{
  size_t sVar1;
  string local_1a0;
  string local_180;
  string local_160;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  size_t idx;
  string *pTargetString_local;
  size_t pArray_Size_local;
  aiColor4D *pArray_local;
  X3DExporter *this_local;
  
  idx = (size_t)pTargetString;
  pTargetString_local = (string *)pArray_Size;
  pArray_Size_local = (size_t)pArray;
  pArray_local = (aiColor4D *)this;
  std::__cxx11::string::clear();
  std::__cxx11::string::reserve(idx);
  for (local_30 = (string *)0x0; sVar1 = idx, local_30 < pTargetString_local;
      local_30 = (string *)&local_30->field_0x1) {
    std::__cxx11::to_string(&local_130,*(float *)(pArray_Size_local + (long)local_30 * 0x10));
    std::operator+(&local_110,&local_130," ");
    std::__cxx11::to_string(&local_160,*(float *)(pArray_Size_local + 4 + (long)local_30 * 0x10));
    std::operator+(&local_f0,&local_110,&local_160);
    std::operator+(&local_d0,&local_f0," ");
    std::__cxx11::to_string(&local_180,*(float *)(pArray_Size_local + 8 + (long)local_30 * 0x10));
    std::operator+(&local_b0,&local_d0,&local_180);
    std::operator+(&local_90,&local_b0," ");
    std::__cxx11::to_string(&local_1a0,*(float *)(pArray_Size_local + 0xc + (long)local_30 * 0x10));
    std::operator+(&local_70,&local_90,&local_1a0);
    std::operator+(&local_50,&local_70," ");
    std::__cxx11::string::append((string *)sVar1);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
  }
  std::__cxx11::string::length();
  std::__cxx11::string::resize(sVar1);
  AttrHelper_CommaToPoint(this,(string *)idx);
  return;
}

Assistant:

void X3DExporter::AttrHelper_Col4DArrToString(const aiColor4D* pArray, const size_t pArray_Size, string& pTargetString)
{
	pTargetString.clear();
	pTargetString.reserve(pArray_Size * 8);// (Number + space) * 4.
	for(size_t idx = 0; idx < pArray_Size; idx++)
		pTargetString.append(to_string(pArray[idx].r) + " " + to_string(pArray[idx].g) + " " + to_string(pArray[idx].b) + " " +
								to_string(pArray[idx].a) + " ");

	// remove last space symbol.
	pTargetString.resize(pTargetString.length() - 1);
	AttrHelper_CommaToPoint(pTargetString);
}